

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  ulong in_RAX;
  ostream *poVar1;
  ulong uStack_18;
  Colour colourGuard;
  
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam000000000017bf10 = 0x2d2d2d2d2d2d2d;
    uRam000000000017bf17._0_1_ = '-';
    uRam000000000017bf17._1_1_ = '-';
    uRam000000000017bf17._2_1_ = '-';
    uRam000000000017bf17._3_1_ = '-';
    uRam000000000017bf17._4_1_ = '-';
    uRam000000000017bf17._5_1_ = '-';
    uRam000000000017bf17._6_1_ = '-';
    uRam000000000017bf17._7_1_ = '-';
    DAT_0017bf00 = '-';
    DAT_0017bf00_1._0_1_ = '-';
    DAT_0017bf00_1._1_1_ = '-';
    DAT_0017bf00_1._2_1_ = '-';
    DAT_0017bf00_1._3_1_ = '-';
    DAT_0017bf00_1._4_1_ = '-';
    DAT_0017bf00_1._5_1_ = '-';
    DAT_0017bf00_1._6_1_ = '-';
    uRam000000000017bf08 = 0x2d2d2d2d2d2d2d;
    DAT_0017bf0f = 0x2d;
    DAT_0017bef0 = '-';
    DAT_0017bef0_1._0_1_ = '-';
    DAT_0017bef0_1._1_1_ = '-';
    DAT_0017bef0_1._2_1_ = '-';
    DAT_0017bef0_1._3_1_ = '-';
    DAT_0017bef0_1._4_1_ = '-';
    DAT_0017bef0_1._5_1_ = '-';
    DAT_0017bef0_1._6_1_ = '-';
    uRam000000000017bef8._0_1_ = '-';
    uRam000000000017bef8._1_1_ = '-';
    uRam000000000017bef8._2_1_ = '-';
    uRam000000000017bef8._3_1_ = '-';
    uRam000000000017bef8._4_1_ = '-';
    uRam000000000017bef8._5_1_ = '-';
    uRam000000000017bef8._6_1_ = '-';
    uRam000000000017bef8._7_1_ = '-';
    DAT_0017bee0 = '-';
    DAT_0017bee0_1._0_1_ = '-';
    DAT_0017bee0_1._1_1_ = '-';
    DAT_0017bee0_1._2_1_ = '-';
    DAT_0017bee0_1._3_1_ = '-';
    DAT_0017bee0_1._4_1_ = '-';
    DAT_0017bee0_1._5_1_ = '-';
    DAT_0017bee0_1._6_1_ = '-';
    uRam000000000017bee8._0_1_ = '-';
    uRam000000000017bee8._1_1_ = '-';
    uRam000000000017bee8._2_1_ = '-';
    uRam000000000017bee8._3_1_ = '-';
    uRam000000000017bee8._4_1_ = '-';
    uRam000000000017bee8._5_1_ = '-';
    uRam000000000017bee8._6_1_ = '-';
    uRam000000000017bee8._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam000000000017bed8._0_1_ = '-';
    uRam000000000017bed8._1_1_ = '-';
    uRam000000000017bed8._2_1_ = '-';
    uRam000000000017bed8._3_1_ = '-';
    uRam000000000017bed8._4_1_ = '-';
    uRam000000000017bed8._5_1_ = '-';
    uRam000000000017bed8._6_1_ = '-';
    uRam000000000017bed8._7_1_ = '-';
    DAT_0017bf1f = 0;
  }
  uStack_18 = in_RAX;
  poVar1 = std::operator<<((ostream *)
                           (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar1,'\n');
  uStack_18 = uStack_18 & 0xffffffffffffff;
  Colour::use(Headers);
  printHeaderString(this,_name,0);
  Colour::~Colour(&colourGuard);
  return;
}

Assistant:

void ConsoleReporter::printOpenHeader(std::string const& _name) {
    stream << getLineOfChars<'-'>() << '\n';
    {
        Colour colourGuard(Colour::Headers);
        printHeaderString(_name);
    }
}